

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaLib.cpp
# Opt level: O0

vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *
xmrig::CudaLib::devices
          (int32_t bfactor,int32_t bsleep,vector<unsigned_int,_std::allocator<unsigned_int>_> *hints
          )

{
  bool bVar1;
  undefined1 uVar2;
  reference puVar3;
  undefined8 in_RCX;
  CudaDevice *in_RDI;
  CudaDevice device_1;
  uint32_t i_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  CudaDevice device;
  uint32_t i;
  uint32_t count;
  vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  CudaDevice *this;
  int32_t in_stack_ffffffffffffff64;
  PciTopology in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff6c;
  CudaDevice *in_stack_ffffffffffffff70;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_68;
  undefined8 local_60;
  CudaDevice local_58;
  uint local_24;
  undefined1 local_1d;
  uint32_t local_1c;
  undefined8 local_18;
  
  this = in_RDI;
  local_18 = in_RCX;
  local_1c = deviceCount();
  if (local_1c == 0) {
    memset(in_RDI,0,0x18);
    std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::vector
              ((vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)0x22b433);
  }
  else {
    local_1d = 0;
    std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::vector
              ((vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)0x22b44a);
    std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::reserve
              ((vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)
               in_stack_ffffffffffffff70,
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    if (bVar1) {
      for (local_24 = 0; local_24 < local_1c; local_24 = local_24 + 1) {
        CudaDevice::CudaDevice
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                   (int32_t)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
        uVar2 = CudaDevice::isValid(&local_58);
        if ((bool)uVar2) {
          std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::
          emplace_back<xmrig::CudaDevice>
                    ((vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)this,in_RDI);
        }
        CudaDevice::~CudaDevice
                  ((CudaDevice *)
                   CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)));
      }
    }
    else {
      local_60 = local_18;
      local_68._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             (in_stack_ffffffffffffff38);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff38);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)CONCAT17(in_stack_ffffffffffffff47,
                                            CONCAT16(in_stack_ffffffffffffff46,
                                                     in_stack_ffffffffffffff40)),
                                (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)in_stack_ffffffffffffff38), bVar1) {
        puVar3 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_68);
        if (*puVar3 < local_1c) {
          CudaDevice::CudaDevice
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                     (int32_t)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
          in_stack_ffffffffffffff46 = CudaDevice::isValid((CudaDevice *)&stack0xffffffffffffff58);
          if ((bool)in_stack_ffffffffffffff46) {
            std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::
            emplace_back<xmrig::CudaDevice>
                      ((vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)this,in_RDI)
            ;
          }
          CudaDevice::~CudaDevice
                    ((CudaDevice *)
                     CONCAT17(in_stack_ffffffffffffff47,
                              CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)));
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&local_68);
      }
    }
  }
  return (vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)this;
}

Assistant:

std::vector<xmrig::CudaDevice> xmrig::CudaLib::devices(int32_t bfactor, int32_t bsleep, const std::vector<uint32_t> &hints) noexcept
{
    const uint32_t count = deviceCount();
    if (!count) {
        return {};
    }

    std::vector<CudaDevice> out;
    out.reserve(count);

    if (hints.empty()) {
        for (uint32_t i = 0; i < count; ++i) {
            CudaDevice device(i, bfactor, bsleep);
            if (device.isValid()) {
                out.emplace_back(std::move(device));
            }
        }
    }
    else {
        for (const uint32_t i : hints) {
            if (i >= count) {
                continue;
            }

            CudaDevice device(i, bfactor, bsleep);
            if (device.isValid()) {
                out.emplace_back(std::move(device));
            }
        }
    }

    return out;
}